

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

char * __thiscall MeCab::anon_unknown_0::TaggerImpl::next(TaggerImpl *this,char *out,size_t len2)

{
  Lattice *pLVar1;
  char *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar5;
  undefined4 extraout_var_01;
  Lattice *pLVar4;
  undefined4 extraout_var_00;
  
  pLVar4 = (this->lattice_).ptr_;
  if (pLVar4 == (Lattice *)0x0) {
    iVar3 = (*(this->current_model_->super_Model)._vptr_Model[4])();
    pLVar4 = (Lattice *)CONCAT44(extraout_var,iVar3);
    pLVar1 = (this->lattice_).ptr_;
    if (pLVar1 != (Lattice *)0x0) {
      (*pLVar1->_vptr_Lattice[0x27])();
    }
    (this->lattice_).ptr_ = pLVar4;
  }
  iVar3 = (*pLVar4->_vptr_Lattice[0x10])(pLVar4);
  if ((char)iVar3 == '\0') {
    (*pLVar4->_vptr_Lattice[0x25])(pLVar4,"no more results");
    pcVar5 = (char *)0x0;
  }
  else {
    iVar3 = (*pLVar4->_vptr_Lattice[0x1b])(pLVar4,out,len2);
    pcVar5 = (char *)CONCAT44(extraout_var_00,iVar3);
    if (pcVar5 == (char *)0x0) {
      iVar3 = (*pLVar4->_vptr_Lattice[0x24])(pLVar4);
      pcVar2 = (char *)(this->what_)._M_string_length;
      strlen((char *)CONCAT44(extraout_var_01,iVar3));
      pcVar5 = (char *)0x0;
      std::__cxx11::string::_M_replace((ulong)&this->what_,0,pcVar2,CONCAT44(extraout_var_01,iVar3))
      ;
    }
  }
  return pcVar5;
}

Assistant:

const char* TaggerImpl::next(char *out, size_t len2) {
  Lattice *lattice = mutable_lattice();
  if (!lattice->next()) {
    lattice->set_what("no more results");
    return 0;
  }
  const char *result = lattice->toString(out, len2);
  if (!result) {
    set_what(lattice->what());
    return 0;
  }
  return result;
}